

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

int smf::MidiFile::secondsearch(void *A,void *B)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*(double *)((long)B + 8) <= *(double *)((long)A + 8)) {
    uVar1 = (uint)(*(double *)((long)B + 8) < *(double *)((long)A + 8));
  }
  return uVar1;
}

Assistant:

int MidiFile::secondsearch(const void* A, const void* B) {
	_TickTime& a = *((_TickTime*)A);
	_TickTime& b = *((_TickTime*)B);

	if (a.seconds < b.seconds) {
		return -1;
	} else if (a.seconds > b.seconds) {
		return 1;
	}
	return 0;
}